

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O3

bool dxil_spv::emit_payload_pointer_resolve
               (Impl *impl,Id linear_node_index_id,NodeLaunchType launch_type,bool is_entry_point)

{
  uint value;
  undefined1 extraout_AL;
  Id IVar1;
  Id IVar2;
  Id IVar3;
  Builder *this;
  Operation *pOVar4;
  Operation *pOVar5;
  Operation *pOVar6;
  uint32_t alignment;
  undefined7 in_register_00000009;
  
  alignment = (uint32_t)CONCAT71(in_register_00000009,is_entry_point);
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar2 = spv::Builder::makeIntegerType(this,0x40,false);
  if (launch_type == Coalescing) {
    IVar2 = emit_load_node_input_push_parameter
                      (impl,NodeEndNodesBDA,(impl->node_input).u32_ptr_type_id);
    IVar2 = emit_load_node_input_push_pointer(impl,IVar2,IVar1,alignment);
    pOVar4 = Converter::Impl::allocate(impl,OpStore);
    Operation::add_id(pOVar4,(impl->node_input).private_coalesce_offset_id);
    Operation::add_id(pOVar4,linear_node_index_id);
    Converter::Impl::add(impl,pOVar4,false);
    pOVar4 = Converter::Impl::allocate(impl,OpISub,IVar1);
    Operation::add_id(pOVar4,IVar2);
    Operation::add_id(pOVar4,linear_node_index_id);
    Converter::Impl::add(impl,pOVar4,false);
    if (impl->glsl_std450_ext == 0) {
      IVar2 = spv::Builder::import(this,"GLSL.std.450");
      impl->glsl_std450_ext = IVar2;
    }
    pOVar5 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
    Operation::add_id(pOVar5,impl->glsl_std450_ext);
    Operation::add_literal(pOVar5,0x26);
    Operation::add_id(pOVar5,pOVar4->id);
    value = (impl->node_input).coalesce_stride;
    IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar1 = spv::Builder::makeIntConstant(this,IVar1,value,false);
    Operation::add_id(pOVar5,IVar1);
    Converter::Impl::add(impl,pOVar5,false);
    pOVar4 = Converter::Impl::allocate(impl,OpStore);
    IVar1 = (impl->node_input).private_coalesce_count_id;
  }
  else {
    if ((impl->node_input).private_bda_var_id == 0) {
      return SUB41(IVar2,0);
    }
    pOVar4 = Converter::Impl::allocate(impl,OpLoad,IVar2);
    Operation::add_id(pOVar4,(impl->node_input).private_bda_var_id);
    Converter::Impl::add(impl,pOVar4,false);
    if (is_entry_point) {
      pOVar6 = Converter::Impl::allocate(impl,OpLoad,IVar1);
      Operation::add_id(pOVar6,(impl->node_input).private_stride_var_id);
      Converter::Impl::add(impl,pOVar6,false);
      pOVar5 = Converter::Impl::allocate(impl,OpIMul,IVar1);
      Operation::add_id(pOVar5,linear_node_index_id);
      Operation::add_id(pOVar5,pOVar6->id);
    }
    else {
      IVar3 = spv::Builder::makeVectorType(this,IVar1,2);
      IVar3 = emit_load_node_input_push_parameter(impl,NodePayloadStrideOrOffsetsBDA,IVar3);
      pOVar5 = Converter::Impl::allocate(impl,OpBitcast,(impl->node_input).u32_array_ptr_type_id);
      Operation::add_id(pOVar5,IVar3);
      Converter::Impl::add(impl,pOVar5,false);
      IVar3 = spv::Builder::makePointer(this,StorageClassPhysicalStorageBuffer,IVar1);
      pOVar6 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar3);
      Operation::add_id(pOVar6,pOVar5->id);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,0,false);
      Operation::add_id(pOVar6,IVar3);
      Operation::add_id(pOVar6,linear_node_index_id);
      Converter::Impl::add(impl,pOVar6,false);
      pOVar5 = Converter::Impl::allocate(impl,OpLoad,IVar1);
      Operation::add_id(pOVar5,pOVar6->id);
      Operation::add_literal(pOVar5,2);
      Operation::add_literal(pOVar5,4);
    }
    Converter::Impl::add(impl,pOVar5,false);
    IVar1 = pOVar5->id;
    pOVar6 = Converter::Impl::allocate(impl,OpUConvert,IVar2);
    Operation::add_id(pOVar6,IVar1);
    Converter::Impl::add(impl,pOVar6,false);
    pOVar5 = Converter::Impl::allocate(impl,OpIAdd,IVar2);
    Operation::add_id(pOVar5,pOVar4->id);
    Operation::add_id(pOVar5,pOVar6->id);
    Converter::Impl::add(impl,pOVar5,false);
    pOVar4 = Converter::Impl::allocate(impl,OpStore);
    IVar1 = (impl->node_input).private_bda_var_id;
  }
  Operation::add_id(pOVar4,IVar1);
  Operation::add_id(pOVar4,pOVar5->id);
  Converter::Impl::add(impl,pOVar4,false);
  return (bool)extraout_AL;
}

Assistant:

static bool emit_payload_pointer_resolve(Converter::Impl &impl, spv::Id linear_node_index_id,
                                         DXIL::NodeLaunchType launch_type, bool is_entry_point)
{
	auto &builder = impl.builder();
	spv::Id u32_type = builder.makeUintType(32);
	spv::Id u64_type = builder.makeUintType(64);

	if (launch_type != DXIL::NodeLaunchType::Coalescing && impl.node_input.private_bda_var_id)
	{
		auto *payload_base = impl.allocate(spv::OpLoad, u64_type);
		payload_base->add_id(impl.node_input.private_bda_var_id);
		impl.add(payload_base);

		spv::Id payload_offset_id;

		// Entry points are linear. Read stride (this can be sourced from GPU buffer, so has to be a pointer).
		if (is_entry_point)
		{
			auto *stride_load = impl.allocate(spv::OpLoad, u32_type);
			stride_load->add_id(impl.node_input.private_stride_var_id);
			impl.add(stride_load);

			auto *payload_offset = impl.allocate(spv::OpIMul, u32_type);
			payload_offset->add_id(linear_node_index_id);
			payload_offset->add_id(stride_load->id);
			impl.add(payload_offset);

			payload_offset_id = payload_offset->id;
		}
		else
		{
			spv::Id uvec2_type = builder.makeVectorType(u32_type, 2);
			spv::Id payload_stride_ptr_uvec2 = emit_load_node_input_push_parameter(
				impl, NodePayloadStrideOrOffsetsBDA, uvec2_type);

			auto *cast_op = impl.allocate(spv::OpBitcast, impl.node_input.u32_array_ptr_type_id);
			cast_op->add_id(payload_stride_ptr_uvec2);
			impl.add(cast_op);

			// Load offset to payload indirectly.
			auto *offset_chain = impl.allocate(
				spv::OpInBoundsAccessChain,
				builder.makePointer(spv::StorageClassPhysicalStorageBuffer, u32_type));

			offset_chain->add_id(cast_op->id);
			offset_chain->add_id(builder.makeUintConstant(0));
			offset_chain->add_id(linear_node_index_id);
			impl.add(offset_chain);

			auto *load_op = impl.allocate(spv::OpLoad, u32_type);
			load_op->add_id(offset_chain->id);
			load_op->add_literal(spv::MemoryAccessAlignedMask);
			load_op->add_literal(sizeof(uint32_t));
			impl.add(load_op);

			payload_offset_id = load_op->id;
		}

		auto *upconv = impl.allocate(spv::OpUConvert, u64_type);
		upconv->add_id(payload_offset_id);
		impl.add(upconv);

		auto *offset_payload = impl.allocate(spv::OpIAdd, u64_type);
		offset_payload->add_id(payload_base->id);
		offset_payload->add_id(upconv->id);
		impl.add(offset_payload);

		auto *store_op = impl.allocate(spv::OpStore);
		store_op->add_id(impl.node_input.private_bda_var_id);
		store_op->add_id(offset_payload->id);
		impl.add(store_op);
	}
	else if (launch_type == DXIL::NodeLaunchType::Coalescing)
	{
		// For Coalesce, we can load an array of payloads, have to defer the resolve.
		// Fortunately, we don't have to read the payload in dispatcher, so we're okay.
		spv::Id end_ptr = emit_load_node_input_push_parameter(impl, NodeEndNodesBDA, impl.node_input.u32_ptr_type_id);
		spv::Id end_id = emit_load_node_input_push_pointer(impl, end_ptr, u32_type, sizeof(uint32_t));

		auto *store_op = impl.allocate(spv::OpStore);
		store_op->add_id(impl.node_input.private_coalesce_offset_id);
		store_op->add_id(linear_node_index_id);
		impl.add(store_op);

		auto *count_id = impl.allocate(spv::OpISub, u32_type);
		count_id->add_id(end_id);
		count_id->add_id(linear_node_index_id);
		impl.add(count_id);

		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");
		auto *min_id = impl.allocate(spv::OpExtInst, u32_type);
		min_id->add_id(impl.glsl_std450_ext);
		min_id->add_literal(GLSLstd450UMin);
		min_id->add_id(count_id->id);
		min_id->add_id(builder.makeUintConstant(impl.node_input.coalesce_stride));
		impl.add(min_id);

		store_op = impl.allocate(spv::OpStore);
		store_op->add_id(impl.node_input.private_coalesce_count_id);
		store_op->add_id(min_id->id);
		impl.add(store_op);
	}

	return true;
}